

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Twine.h
# Opt level: O0

Twine * __thiscall llvm::Twine::concat(Twine *__return_storage_ptr__,Twine *this,Twine *Suffix)

{
  NodeKind NVar1;
  undefined6 uVar2;
  bool bVar3;
  NodeKind local_2a;
  NodeKind local_29;
  NodeKind NewRHSKind;
  Child CStack_28;
  NodeKind NewLHSKind;
  Child NewRHS;
  Child NewLHS;
  Twine *Suffix_local;
  Twine *this_local;
  
  bVar3 = isNull(this);
  if ((bVar3) || (bVar3 = isNull(Suffix), bVar3)) {
    Twine(__return_storage_ptr__,NullKind);
  }
  else {
    bVar3 = isEmpty(this);
    if (bVar3) {
      __return_storage_ptr__->LHS = Suffix->LHS;
      __return_storage_ptr__->RHS = Suffix->RHS;
      NVar1 = Suffix->RHSKind;
      uVar2 = *(undefined6 *)&Suffix->field_0x12;
      __return_storage_ptr__->LHSKind = Suffix->LHSKind;
      __return_storage_ptr__->RHSKind = NVar1;
      *(undefined6 *)&__return_storage_ptr__->field_0x12 = uVar2;
    }
    else {
      bVar3 = isEmpty(Suffix);
      if (bVar3) {
        __return_storage_ptr__->LHS = this->LHS;
        __return_storage_ptr__->RHS = this->RHS;
        NVar1 = this->RHSKind;
        uVar2 = *(undefined6 *)&this->field_0x12;
        __return_storage_ptr__->LHSKind = this->LHSKind;
        __return_storage_ptr__->RHSKind = NVar1;
        *(undefined6 *)&__return_storage_ptr__->field_0x12 = uVar2;
      }
      else {
        local_29 = TwineKind;
        local_2a = TwineKind;
        bVar3 = isUnary(this);
        NewRHS.twine = this;
        if (bVar3) {
          NewRHS = this->LHS;
          local_29 = getLHSKind(this);
        }
        bVar3 = isUnary(Suffix);
        CStack_28.twine = Suffix;
        if (bVar3) {
          CStack_28 = Suffix->LHS;
          local_2a = getLHSKind(Suffix);
        }
        Twine(__return_storage_ptr__,NewRHS,local_29,CStack_28,local_2a);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline Twine Twine::concat(const Twine &Suffix) const {
    // Concatenation with null is null.
    if (isNull() || Suffix.isNull())
      return Twine(NullKind);

    // Concatenation with empty yields the other side.
    if (isEmpty())
      return Suffix;
    if (Suffix.isEmpty())
      return *this;

    // Otherwise we need to create a new node, taking care to fold in unary
    // twines.
    Child NewLHS, NewRHS;
    NewLHS.twine = this;
    NewRHS.twine = &Suffix;
    NodeKind NewLHSKind = TwineKind, NewRHSKind = TwineKind;
    if (isUnary()) {
      NewLHS = LHS;
      NewLHSKind = getLHSKind();
    }
    if (Suffix.isUnary()) {
      NewRHS = Suffix.LHS;
      NewRHSKind = Suffix.getLHSKind();
    }

    return Twine(NewLHS, NewLHSKind, NewRHS, NewRHSKind);
  }